

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMfs.c
# Opt level: O0

Abc_Ntk_t *
Abc_NtkUnrollAndDrop(Abc_Ntk_t *p,int nFrames,int nFramesAdd,Vec_Int_t *vFlops,int *piPivot)

{
  anon_union_8_4_617c9805_for_Abc_Obj_t__17 aVar1;
  int iVar2;
  int iVar3;
  Abc_Ntk_t *pNtk_00;
  char *pcVar4;
  Abc_Obj_t *pAVar5;
  Vec_Ptr_t *p_00;
  Abc_Obj_t *pAVar6;
  int local_54;
  int Value;
  int f;
  int k;
  int i;
  Vec_Ptr_t *vNodes;
  Abc_Obj_t *pNode;
  Abc_Obj_t *pFanin;
  Abc_Ntk_t *pNtk;
  int *piPivot_local;
  Vec_Int_t *vFlops_local;
  int nFramesAdd_local;
  int nFrames_local;
  Abc_Ntk_t *p_local;
  
  if (nFramesAdd < 0) {
    __assert_fail("nFramesAdd >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcMfs.c"
                  ,0x194,
                  "Abc_Ntk_t *Abc_NtkUnrollAndDrop(Abc_Ntk_t *, int, int, Vec_Int_t *, int *)");
  }
  iVar2 = Abc_NtkIsLogic(p);
  if (iVar2 != 0) {
    iVar2 = Vec_IntSize(vFlops);
    iVar3 = Abc_NtkLatchNum(p);
    if (iVar2 == iVar3) {
      *piPivot = -1;
      pNtk_00 = Abc_NtkAlloc(p->ntkType,p->ntkFunc,1);
      pcVar4 = Abc_NtkName(p);
      pcVar4 = Extra_UtilStrsav(pcVar4);
      pNtk_00->pName = pcVar4;
      for (f = 0; iVar2 = Abc_NtkCiNum(p), f < iVar2; f = f + 1) {
        pAVar5 = Abc_NtkCi(p,f);
        pAVar6 = Abc_NtkCreatePi(pNtk_00);
        (pAVar5->field_6).pCopy = pAVar6;
      }
      p_00 = Abc_NtkDfs(p,0);
      for (local_54 = 0; local_54 <= nFrames + nFramesAdd; local_54 = local_54 + 1) {
        if (0 < local_54) {
          for (f = 0; iVar2 = Abc_NtkPiNum(p), f < iVar2; f = f + 1) {
            pAVar5 = Abc_NtkPi(p,f);
            pAVar6 = Abc_NtkCreatePi(pNtk_00);
            (pAVar5->field_6).pCopy = pAVar6;
          }
        }
        for (f = 0; iVar2 = Vec_PtrSize(p_00), f < iVar2; f = f + 1) {
          pAVar5 = (Abc_Obj_t *)Vec_PtrEntry(p_00,f);
          Abc_NtkDupObj(pNtk_00,pAVar5,0);
          for (Value = 0; iVar2 = Abc_ObjFaninNum(pAVar5), Value < iVar2; Value = Value + 1) {
            pAVar6 = Abc_ObjFanin(pAVar5,Value);
            Abc_ObjAddFanin((pAVar5->field_6).pCopy,(pAVar6->field_6).pCopy);
          }
        }
        for (f = 0; iVar2 = Abc_NtkCoNum(p), f < iVar2; f = f + 1) {
          pAVar5 = Abc_NtkCo(p,f);
          pAVar6 = Abc_ObjFanin0(pAVar5);
          pAVar5->field_6 = pAVar6->field_6;
        }
        for (f = 0; iVar2 = Abc_NtkPoNum(p), f < iVar2; f = f + 1) {
          pAVar5 = Abc_NtkPo(p,f);
          pAVar6 = Abc_NtkCreatePo(pNtk_00);
          Abc_ObjAddFanin(pAVar6,(pAVar5->field_6).pCopy);
        }
        if (local_54 == 0) {
          iVar2 = Abc_NtkObjNum(pNtk_00);
          *piPivot = iVar2;
        }
        for (f = 0; iVar2 = Vec_PtrSize(p->vBoxes), f < iVar2; f = f + 1) {
          pAVar5 = Abc_NtkBox(p,f);
          iVar2 = Abc_ObjIsLatch(pAVar5);
          if (iVar2 != 0) {
            pAVar6 = Abc_ObjFanin0(pAVar5);
            aVar1 = pAVar6->field_6;
            pAVar5 = Abc_ObjFanout0(pAVar5);
            pAVar5->field_6 = aVar1;
          }
        }
        if (nFramesAdd < local_54) {
          for (f = 0; iVar2 = Vec_IntSize(vFlops), f < iVar2; f = f + 1) {
            iVar2 = Vec_IntEntry(vFlops,f);
            if (iVar2 != 0) {
              iVar2 = Abc_NtkPoNum(p);
              pAVar5 = Abc_NtkCo(p,iVar2 + f);
              pAVar6 = Abc_NtkCreatePo(pNtk_00);
              Abc_ObjAddFanin(pAVar6,(pAVar5->field_6).pCopy);
            }
          }
        }
      }
      Vec_PtrFree(p_00);
      Abc_NtkAddDummyPiNames(pNtk_00);
      Abc_NtkAddDummyPoNames(pNtk_00);
      Abc_NtkCleanup(pNtk_00,0);
      iVar2 = Abc_NtkCheck(pNtk_00);
      if (iVar2 == 0) {
        fprintf(_stdout,"Abc_NtkCreateFromNode(): Network check has failed.\n");
      }
      return pNtk_00;
    }
    __assert_fail("Vec_IntSize(vFlops) == Abc_NtkLatchNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcMfs.c"
                  ,0x196,
                  "Abc_Ntk_t *Abc_NtkUnrollAndDrop(Abc_Ntk_t *, int, int, Vec_Int_t *, int *)");
  }
  __assert_fail("Abc_NtkIsLogic(p)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcMfs.c"
                ,0x195,"Abc_Ntk_t *Abc_NtkUnrollAndDrop(Abc_Ntk_t *, int, int, Vec_Int_t *, int *)")
  ;
}

Assistant:

Abc_Ntk_t * Abc_NtkUnrollAndDrop( Abc_Ntk_t * p, int nFrames, int nFramesAdd, Vec_Int_t * vFlops, int * piPivot )
{
    Abc_Ntk_t * pNtk; 
    Abc_Obj_t * pFanin, * pNode;
    Vec_Ptr_t * vNodes;
    int i, k, f, Value;
    assert( nFramesAdd >= 0 );
    assert( Abc_NtkIsLogic(p) );
    assert( Vec_IntSize(vFlops) == Abc_NtkLatchNum(p) );
    *piPivot = -1;
    // start the network
    pNtk = Abc_NtkAlloc( p->ntkType, p->ntkFunc, 1 );
    pNtk->pName = Extra_UtilStrsav(Abc_NtkName(p));
    // add CIs for the new network
    Abc_NtkForEachCi( p, pNode, i )
        pNode->pCopy = Abc_NtkCreatePi( pNtk );
    // iterate unrolling
    vNodes = Abc_NtkDfs( p, 0 );
    for ( f = 0; f <= nFrames + nFramesAdd; f++ )
    {
        if ( f > 0 )
        {
            Abc_NtkForEachPi( p, pNode, i )
                pNode->pCopy = Abc_NtkCreatePi( pNtk );
        }
        Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pNode, i )
        {
            Abc_NtkDupObj( pNtk, pNode, 0 );
            Abc_ObjForEachFanin( pNode, pFanin, k )
                Abc_ObjAddFanin( pNode->pCopy, pFanin->pCopy );
        }
        Abc_NtkForEachCo( p, pNode, i )
            pNode->pCopy = Abc_ObjFanin0(pNode)->pCopy;
        Abc_NtkForEachPo( p, pNode, i )
            Abc_ObjAddFanin( Abc_NtkCreatePo(pNtk), pNode->pCopy );
        // add buffers
        if ( f == 0 )
        {
            *piPivot = Abc_NtkObjNum(pNtk);
//            Abc_NtkForEachLatchInput( p, pNode, i )
//                pNode->pCopy = Abc_NtkCreateNodeBuf( pNtk, pNode->pCopy );
        }
        // transfer to flop outputs
        Abc_NtkForEachLatch( p, pNode, i )
            Abc_ObjFanout0(pNode)->pCopy = Abc_ObjFanin0(pNode)->pCopy;
        // add final POs
        if ( f > nFramesAdd )
        {
            Vec_IntForEachEntry( vFlops, Value, i )
            {
                if ( Value == 0 )
                    continue;
                pNode = Abc_NtkCo( p, Abc_NtkPoNum(p) + i );
                Abc_ObjAddFanin( Abc_NtkCreatePo(pNtk), pNode->pCopy );
            }
        }
    }
    Vec_PtrFree( vNodes );
    Abc_NtkAddDummyPiNames( pNtk );
    Abc_NtkAddDummyPoNames( pNtk );
    // perform combinational cleanup
    Abc_NtkCleanup( pNtk, 0 );
    if ( !Abc_NtkCheck( pNtk ) )
        fprintf( stdout, "Abc_NtkCreateFromNode(): Network check has failed.\n" );
    return pNtk;
}